

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *delta;
  Verbosity old_verbosity;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000240;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000248;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe18;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe20;
  SPxId *in_stack_fffffffffffffe38;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe40;
  int local_18c;
  undefined1 local_188 [48];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffea8;
  undefined8 local_148;
  undefined1 local_140 [48];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  DataKey in_stack_fffffffffffffef8;
  undefined4 local_100;
  Verbosity local_fc;
  undefined1 local_f8 [56];
  DataKey local_c0;
  DataKey local_b0;
  SPxId **local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  undefined8 *local_80;
  SPxId **local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  SPxId **local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  SPxId::SPxId((SPxId *)0x379d09);
  local_a8 = &(in_RDI->theBaseId).data;
  local_a0 = local_f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_c0 = (DataKey)selectEnterX(in_stack_00000248,in_stack_00000240);
  local_b0 = local_c0;
  bVar2 = SPxId::isValid((SPxId *)&local_b0);
  if ((!bVar2) && ((in_RDI->field_0x1b4 & 1) == 0)) {
    in_RDI->field_0x1b4 = 1;
    if ((*(long *)(*(long *)&in_RDI->theBaseId + 0xda8) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0xda8)),
       4 < (int)VVar3)) {
      local_fc = SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0xda8));
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0xda8);
      local_100 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_100);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0xda8);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_fc);
    }
    local_78 = &(in_RDI->theBaseId).data;
    local_148 = 0x4000000000000000;
    local_70 = local_140;
    local_80 = &local_148;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_81,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_78);
    local_68 = local_140;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffe20);
    local_58 = local_140;
    local_60 = local_78;
    local_50 = local_80;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(double *)0x379f16);
    in_stack_fffffffffffffef8 = (DataKey)selectEnterX(in_stack_00000248,in_stack_00000240);
    local_b0 = in_stack_fffffffffffffef8;
  }
  bVar2 = SPxId::isValid((SPxId *)&local_b0);
  if (bVar2) {
    this_00 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::fVec(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)&in_RDI->theBaseId);
    x = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::delta(this_00);
    this_01 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        **)&in_RDI->theBaseId);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::vector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(in_RDI,x,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)this_01);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    local_18c = 1;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2(in_stack_fffffffffffffea8);
    local_28 = local_188;
    local_30 = &local_18c;
    local_38 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xfffffffffffffe3c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_188;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)this_01);
    local_8 = local_188;
    local_10 = local_38;
    local_18 = local_30;
    local_48 = (long)*local_30;
    boost::multiprecision::default_ops::
    eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              ((cpp_dec_float<50U,_int,_void> *)this_01,in_stack_fffffffffffffe18,
               (longlong *)0x37a0a8);
    local_90 = &in_RDI->minStab;
    local_98 = local_188;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)this_01,in_stack_fffffffffffffe18);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setup4coSolve(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&in_RDI->theBaseId,
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((in_RDI->nonzeroFactor).m_backend.data._M_elems + 4),
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(in_RDI->fillFactor).m_backend.exp);
  }
  return (SPxId)local_b0;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}